

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ushort smf::MidiFile::readLittleEndian2Bytes(istream *input)

{
  ushort uVar1;
  ostream *poVar2;
  uchar buffer [2];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  std::istream::read((char *)input,(long)buffer);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    uVar1 = (short)buffer << 8 | (ushort)buffer >> 8;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

ushort MidiFile::readLittleEndian2Bytes(std::istream& input) {
	uchar buffer[2] = {0};
	input.read((char*)buffer, 2);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[1] | (buffer[0] << 8);
}